

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::anon_unknown_0::text_output
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  byte bVar1;
  byte *pbVar2;
  undefined4 in_register_0000000c;
  size_t sVar3;
  void *__buf;
  void *__buf_00;
  int iVar4;
  byte *pbVar5;
  void *pvStack_40;
  
  pvStack_40 = (void *)CONCAT44(in_register_0000000c,flags);
  if ((flags & 0x10) != 0) {
    xml_buffered_writer::write_string(writer,s);
    return;
  }
LAB_00126857:
  do {
    do {
      if (*s == 0) {
        return;
      }
      pbVar2 = s + 1;
      do {
        pbVar5 = pbVar2;
        if (((byte)(anonymous_namespace)::chartypex_table[pbVar5[-1]] & type) != 0) {
          pbVar5 = pbVar5 + -1;
          goto LAB_001268b1;
        }
        if (((byte)(anonymous_namespace)::chartypex_table[*pbVar5] & type) != 0) goto LAB_001268b1;
        if (((byte)(anonymous_namespace)::chartypex_table[pbVar5[1]] & type) != 0) {
          pbVar5 = pbVar5 + 1;
          goto LAB_001268b1;
        }
        pbVar2 = pbVar5 + 4;
      } while (((byte)(anonymous_namespace)::chartypex_table[pbVar5[2]] & type) == 0);
      pbVar5 = pbVar5 + 2;
LAB_001268b1:
      xml_buffered_writer::write_buffer(writer,s,(long)pbVar5 - (long)s);
      bVar1 = *pbVar5;
      s = pbVar5;
    } while (bVar1 == 0);
    if (bVar1 == 0x22) {
      if ((flags >> 9 & 1) == 0) {
        iVar4 = 0x71;
        __buf_00 = (void *)0x75;
        pvStack_40 = (void *)0x74;
LAB_00126994:
        xml_buffered_writer::write(writer,iVar4,__buf_00,(size_t)pvStack_40);
      }
      else {
        iVar4 = 0x22;
LAB_0012699e:
        xml_buffered_writer::write(writer,iVar4,__buf,(size_t)pvStack_40);
      }
    }
    else {
      if (bVar1 == 0x3e) {
        pvStack_40 = (void *)0x67;
      }
      else {
        if (bVar1 == 0x27) {
          if ((flags >> 9 & 1) != 0) {
            iVar4 = 0x61;
            __buf_00 = (void *)0x70;
            pvStack_40 = (void *)0x73;
            goto LAB_00126994;
          }
          iVar4 = 0x27;
          goto LAB_0012699e;
        }
        if (bVar1 != 0x3c) {
          if (bVar1 == 0x26) {
            pvStack_40 = (void *)0x6d;
            xml_buffered_writer::write(writer,0x26,(void *)0x61,0x6d);
            goto LAB_001269a4;
          }
          if (0x1f < bVar1) {
            __assert_fail("ch < 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0xf6d,
                          "void pugi::impl::(anonymous namespace)::text_output_escaped(xml_buffered_writer &, const char_t *, chartypex_t, unsigned int)"
                         );
          }
          s = pbVar5 + 1;
          if ((flags >> 8 & 1) == 0) {
            pvStack_40 = (void *)(ulong)(byte)(bVar1 / 10 | 0x30);
            xml_buffered_writer::write(writer,0x26,(void *)0x23,(size_t)pvStack_40);
          }
          goto LAB_00126857;
        }
        pvStack_40 = (void *)0x6c;
      }
      sVar3 = 0x74;
      xml_buffered_writer::write(writer,0x26,pvStack_40,0x74);
      pvStack_40 = (void *)sVar3;
    }
LAB_001269a4:
    s = pbVar5 + 1;
  } while( true );
}

Assistant:

PUGI__FN void text_output(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		if (flags & format_no_escapes)
			writer.write_string(s);
		else
			text_output_escaped(writer, s, type, flags);
	}